

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O1

int slist_search(int n,Symbol *s)

{
  int *piVar1;
  long lVar2;
  
  piVar1 = s->slist_info_;
  if (piVar1 == (int *)0x0) {
    diag(s->name," not really a STATE; Ie. No differential equation for it.\n");
  }
  if (0 < (long)*piVar1) {
    lVar2 = 0;
    do {
      if (piVar1[lVar2 * 2 + 1] == n) {
        return piVar1[lVar2 * 2 + 2];
      }
      lVar2 = lVar2 + 1;
    } while (*piVar1 != lVar2);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                ,0xaba,"int slist_search()");
}

Assistant:

int slist_search(n, s) int n; Symbol* s; {
	int i, *pi;
	pi = s->slist_info_;
if (pi == (int*)0) {
	diag(s->name, " not really a STATE; Ie. No differential equation for it.\n");
}
	assert(pi);
	for (i=0; i < pi[0]; ++i) {
		if (pi[1+2*i] == n) {
			return pi[2+2*i];
		}
	}
	assert(0);
	return 0;
}